

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O1

bool __thiscall
glcts::ViewportArray::ScissorClear::checkResults
          (ScissorClear *this,texture *texture_0,texture *param_2,GLuint param_3)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  GLuint y;
  long lVar4;
  GLuint x;
  vector<int,_std::allocator<int>_> texture_data;
  vector<int,_std::allocator<int>_> local_58;
  long local_38;
  
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&local_58,0x40000);
  Utils::texture::get(texture_0,0x8d94,0x1404,
                      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
  bVar3 = true;
  lVar4 = 0;
  do {
    y = 0;
    local_38 = lVar4;
    do {
      x = 0;
      do {
        bVar1 = DrawTestBase::checkRegionR32I
                          ((DrawTestBase *)this,x,y,0x20,0x20,-(uint)(x != 0 || y != 0),
                           local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar4 * 0x4000);
        if (!bVar1) {
          bVar3 = false;
          iVar2 = 0xb;
          goto LAB_00deb879;
        }
        x = x + 1;
      } while (x != 4);
      iVar2 = 8;
LAB_00deb879:
      if (!bVar1) goto LAB_00deb889;
      y = y + 1;
    } while (y != 4);
    iVar2 = 5;
LAB_00deb889:
    if ((iVar2 != 5) || (lVar4 = local_38 + 1, lVar4 == 0x10)) {
      if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return bVar3;
    }
  } while( true );
}

Assistant:

bool ScissorClear::checkResults(Utils::texture& texture_0, Utils::texture& /* texture_1 */, GLuint /*draw_call_index */)
{
	static const GLuint layer_size = m_width * m_height;

	bool check_result = true;

	std::vector<GLint> texture_data;
	texture_data.resize(layer_size * m_depth);
	texture_0.get(GL_RED_INTEGER, GL_INT, &texture_data[0]);

	/* 16 layers, only region corresponding with scissor box 0 should be modified */
	for (GLuint layer = 0; layer < m_depth; ++layer)
	{
		for (GLuint y = 0; y < 4; ++y)
		{
			for (GLuint x = 0; x < 4; ++x)
			{
				GLint* layer_data = &texture_data[layer * layer_size];

				GLint expected_value = -1;
				if ((0 == x) && (0 == y))
				{
					expected_value = 0;
				}

				bool result = checkRegionR32I(x, y, expected_value, layer_data);

				if (false == result)
				{
					check_result = false;
					goto end;
				}
			}
		}
	}

end:
	return check_result;
}